

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::InputFile::InputFile(InputFile *this,IStream *is,int numThreads)

{
  Data **ppDVar1;
  bool bVar2;
  Data *pDVar3;
  InputStreamMutex *pIVar4;
  string *type;
  stringstream _iex_replace_s;
  
  GenericInputFile::GenericInputFile(&this->super_GenericInputFile);
  (this->super_GenericInputFile)._vptr_GenericInputFile = (_func_int **)&PTR__InputFile_0036b150;
  pDVar3 = (Data *)operator_new(0x108);
  Data::Data(pDVar3,numThreads);
  ppDVar1 = &this->_data;
  this->_data = pDVar3;
  pDVar3->_streamData = (InputStreamMutex *)0x0;
  pDVar3->_deleteStream = false;
  GenericInputFile::readMagicNumberAndVersionField
            (&this->super_GenericInputFile,is,&pDVar3->version);
  pDVar3 = *ppDVar1;
  if ((pDVar3->version & 0x1000) == 0) {
    pIVar4 = (InputStreamMutex *)operator_new(0x38);
    (pIVar4->super_Mutex).super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    pIVar4->is = (IStream *)0x0;
    *(undefined8 *)((long)&(pIVar4->super_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
    (pIVar4->super_Mutex).super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    (pIVar4->super_Mutex).super___mutex_base._M_mutex.__align = 0;
    *(undefined8 *)((long)&(pIVar4->super_Mutex).super___mutex_base._M_mutex + 8) = 0;
    pIVar4->currentPosition = 0;
    pDVar3->_streamData = pIVar4;
    pIVar4->is = is;
    Header::readFrom(&pDVar3->header,is,&pDVar3->version);
    if (((*ppDVar1)->version & 0x1800) == 0) {
      bVar2 = Header::hasType(&(*ppDVar1)->header);
      if (bVar2) {
        type = (string *)&TILEDIMAGE_abi_cxx11_;
        if (((uint)(*ppDVar1)->version >> 9 & 1) == 0) {
          type = (string *)&SCANLINEIMAGE_abi_cxx11_;
        }
        Header::setType(&(*ppDVar1)->header,type);
      }
    }
    Header::sanityCheck(&(*ppDVar1)->header,(bool)((byte)((uint)(*ppDVar1)->version >> 9) & 1),false
                       );
    initialize(this);
  }
  else {
    compatibilityInitialize(this,is);
  }
  return;
}

Assistant:

InputFile::InputFile (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int numThreads):
    _data (new Data (numThreads))
{
    _data->_streamData=NULL;
    _data->_deleteStream=false;
    try
    {
        readMagicNumberAndVersionField(is, _data->version);

        //
        // Backward compatibility to read multpart file.
        //
        if (isMultiPart(_data->version))
        {
            compatibilityInitialize(is);
        }
        else
        {
            _data->_streamData = new InputStreamMutex();
            _data->_streamData->is = &is;
            _data->header.readFrom (*_data->_streamData->is, _data->version);
            
            // fix type attribute in single part regular image types
            // (may be wrong if an old version of OpenEXR converts
            // a tiled image to scanline or vice versa)
            if(!isNonImage(_data->version)  && 
               !isMultiPart(_data->version) &&  
               _data->header.hasType())
            {
                _data->header.setType(isTiled(_data->version) ? TILEDIMAGE : SCANLINEIMAGE);
            }
            
            _data->header.sanityCheck (isTiled (_data->version));

            initialize();
        }
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        if (_data && !_data->multiPartBackwardSupport && _data->_streamData) delete _data->_streamData;
        if (_data)       delete _data;
        _data=NULL; 

        REPLACE_EXC (e, "Cannot read image file "
                     "\"" << is.fileName() << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        if (_data &&  !_data->multiPartBackwardSupport  && _data->_streamData) delete _data->_streamData;
        if (_data)       delete _data;
        _data=NULL;
        throw;
    }
}